

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::LocalsWalker::LocalsWalker(LocalsWalker *this,DiagStackFrame *_frame,DWORD _frameWalkerFlags)

{
  byte bVar1;
  DiagStackFrame *pDVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  DWORD DVar7;
  RegSlot RVar8;
  ScopeType SVar9;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ArenaAllocator *alloc;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar10;
  FrameDisplay *this_01;
  ScopeObjectChain *pSVar11;
  DiagScopeVariablesWalker *pDVar12;
  undefined4 extraout_var_02;
  DebuggerScope *scope;
  void *pvVar13;
  undefined4 extraout_var_03;
  undefined4 *puVar14;
  PropertyIdOnRegSlotsContainer *pPVar15;
  undefined *puVar16;
  undefined4 extraout_var_04;
  void *scope_00;
  RecyclableObjectWalker *this_02;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  byte bVar17;
  undefined **ppuVar18;
  uint i;
  uint uVar19;
  uint uVar20;
  undefined **local_88;
  DiagScopeVariablesWalker *local_40;
  uint local_34;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
       (_func_int **)&PTR_Get_0137ed70;
  this->pFrame = _frame;
  this->pVarWalkers =
       (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  this->totalLocalsCount = 0;
  this->frameWalkerFlags = _frameWalkerFlags;
  this->hasUserNotDefinedArguments = false;
  iVar6 = (*_frame->_vptr_DiagStackFrame[2])(_frame);
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar6));
  if (this_00 == (FunctionBody *)0x0) {
    return;
  }
  if ((((this_00->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8
      & 4) != 0) {
    return;
  }
  iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
  alloc = (ArenaAllocator *)CONCAT44(extraout_var_00,iVar6);
  pLVar10 = JsUtil::
            List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::New(alloc,4);
  this->pVarWalkers = pLVar10;
  iVar6 = (*this->pFrame->_vptr_DiagStackFrame[0xf])();
  this_01 = (FrameDisplay *)CONCAT44(extraout_var_01,iVar6);
  if (this_01 == (FrameDisplay *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = (uint)this_01->length;
  }
  pSVar11 = FunctionBody::GetScopeObjectChain(this_00);
  if (pSVar11 != (ScopeObjectChain *)0x0) {
    pLVar10 = this->pVarWalkers;
    pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
    DiagScopeVariablesWalker::DiagScopeVariablesWalker
              (pDVar12,this->pFrame,(Var)0x0,SUB41((this->frameWalkerFlags & 2) >> 1,0));
    local_40 = pDVar12;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pLVar10,(VariableWalkerBase **)&local_40);
  }
  if (((this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 0x10) == 0) {
    bVar17 = 0;
  }
  else {
    bVar17 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 ^ 1;
  }
  bVar4 = (byte)this->frameWalkerFlags;
  if (((~bVar17 | bVar4 >> 4) & 1) == 0) {
    pLVar10 = this->pVarWalkers;
    pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
    pDVar2 = this->pFrame;
    iVar6 = (*pDVar2->_vptr_DiagStackFrame[0x11])(pDVar2);
    (pDVar12->super_VariableWalkerBase).pFrame = pDVar2;
    (pDVar12->super_VariableWalkerBase).instance = (Var)CONCAT44(extraout_var_02,iVar6);
    (pDVar12->super_VariableWalkerBase).pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    *(undefined8 *)((long)&(pDVar12->super_VariableWalkerBase).pMembersList + 6) = 0;
    (pDVar12->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137fa50;
    local_40 = pDVar12;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pLVar10,(VariableWalkerBase **)&local_40);
  }
  scope = GetScopeWhenHaltAtFormals(this->pFrame);
  DVar7 = GetCurrentFramesLocalsType(this->pFrame);
  bVar5 = VariableWalkerBase::IsInParamScope(scope,this->pFrame);
  if ((!bVar5) || (uVar19 = 0, (this_00->field_0x17b & 4) != 0)) {
    if ((DVar7 & 4) == 0) {
      if ((DVar7 & 2) == 0) {
        uVar19 = 0;
        if (((local_34 != 0) && (RVar8 = FunctionBody::GetFrameDisplayRegister(this_00), RVar8 != 0)
            ) && ((this_00->field_0x17b & 4) != 0)) {
          uVar19 = 1;
          pvVar13 = FrameDisplay::GetItem(this_01,0);
          iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
          if (pvVar13 != *(void **)(*(long *)(CONCAT44(extraout_var_03,iVar6) + 8) + 0x438)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar14 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x45e,
                                        "((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull())"
                                        ,
                                        "(Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull()"
                                       );
            if (!bVar5) goto LAB_007e929f;
            *puVar14 = 0;
          }
        }
        goto LAB_007e8e03;
      }
      puVar16 = &SlotArrayVariablesWalker::vtable;
      if (local_34 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        uVar19 = 0x458;
        goto LAB_007e8d79;
      }
    }
    else {
      puVar16 = &ObjectVariablesWalker::vtable;
      if (local_34 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        uVar19 = 0x452;
LAB_007e8d79:
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,uVar19,"(scopeCount > 0)","scopeCount > 0");
        if (!bVar5) goto LAB_007e929f;
        *puVar14 = 0;
      }
    }
    pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
    pDVar2 = this->pFrame;
    pvVar13 = FrameDisplay::GetItem(this_01,0);
    bVar1 = (byte)this->frameWalkerFlags;
    (pDVar12->super_VariableWalkerBase).pFrame = pDVar2;
    (pDVar12->super_VariableWalkerBase).instance = pvVar13;
    (pDVar12->super_VariableWalkerBase).pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    (pDVar12->super_VariableWalkerBase).groupType = UIGroupType_None;
    (pDVar12->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
    (pDVar12->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
    (pDVar12->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)(puVar16 + 0x10);
    local_40 = pDVar12;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->pVarWalkers,(VariableWalkerBase **)&local_40);
    uVar19 = 1;
  }
LAB_007e8e03:
  if ((scope != (DebuggerScope *)0x0) && ((this_00->field_0x17b & 4) == 0)) {
    pPVar15 = FunctionProxy::
              GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                        ((FunctionProxy *)this_00);
    if (pPVar15 != (PropertyIdOnRegSlotsContainer *)0x0) {
      pPVar15 = FunctionProxy::
                GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                          ((FunctionProxy *)this_00);
      DVar7 = DVar7 | pPVar15->formalsUpperBound != 0xffffffff;
    }
    if (local_34 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x470,"(scopeCount > 0)","scopeCount > 0");
      if (!bVar5) {
LAB_007e929f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar14 = 0;
    }
    pLVar10 = this->pVarWalkers;
    if (scope->scopeType == DiagParamScopeInObject) {
      pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
      pDVar2 = this->pFrame;
      pvVar13 = FrameDisplay::GetItem(this_01,uVar19);
      bVar1 = (byte)this->frameWalkerFlags;
      (pDVar12->super_VariableWalkerBase).pFrame = pDVar2;
      (pDVar12->super_VariableWalkerBase).instance = pvVar13;
      (pDVar12->super_VariableWalkerBase).pMembersList =
           (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      (pDVar12->super_VariableWalkerBase).groupType = UIGroupType_Param;
      (pDVar12->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
      (pDVar12->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
      puVar16 = &ObjectVariablesWalker::vtable;
    }
    else {
      pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
      pDVar2 = this->pFrame;
      pvVar13 = FrameDisplay::GetItem(this_01,uVar19);
      bVar1 = (byte)this->frameWalkerFlags;
      (pDVar12->super_VariableWalkerBase).pFrame = pDVar2;
      (pDVar12->super_VariableWalkerBase).instance = pvVar13;
      (pDVar12->super_VariableWalkerBase).pMembersList =
           (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)0x0;
      (pDVar12->super_VariableWalkerBase).groupType = UIGroupType_Param;
      (pDVar12->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
      (pDVar12->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
      puVar16 = &SlotArrayVariablesWalker::vtable;
    }
    (pDVar12->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)(puVar16 + 0x10);
    local_40 = pDVar12;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pLVar10,(VariableWalkerBase **)&local_40);
    uVar19 = uVar19 + 1;
  }
  uVar20 = local_34;
  if ((DVar7 & 1) != 0) {
    pLVar10 = this->pVarWalkers;
    local_40 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x30,alloc,0x35916e);
    DVar7 = this->frameWalkerFlags;
    (local_40->super_VariableWalkerBase).pFrame = this->pFrame;
    (local_40->super_VariableWalkerBase).instance = (Var)0x0;
    (local_40->super_VariableWalkerBase).pMembersList =
         (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    *(undefined8 *)((long)&(local_40->super_VariableWalkerBase).pMembersList + 5) = 0;
    (local_40->super_VariableWalkerBase).allowSuperReference = (bool)((byte)DVar7 >> 3 & 1);
    (local_40->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137f960;
    local_40->pDiagScopeObjects =
         (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0;
    JsUtil::
    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(pLVar10,(VariableWalkerBase **)&local_40);
  }
  iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
  pvVar13 = *(void **)(*(long *)(CONCAT44(extraout_var_04,iVar6) + 8) + 0x438);
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_88 = &PTR_Get_0137fa00;
  do {
    if (uVar20 <= uVar19) {
      if (((bVar17 | bVar4 >> 4) & 1) == 0) {
        pLVar10 = this->pVarWalkers;
        pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
        pDVar2 = this->pFrame;
        iVar6 = (*pDVar2->_vptr_DiagStackFrame[0x11])(pDVar2);
        (pDVar12->super_VariableWalkerBase).pFrame = pDVar2;
        (pDVar12->super_VariableWalkerBase).instance = (Var)CONCAT44(extraout_var_06,iVar6);
        (pDVar12->super_VariableWalkerBase).pMembersList =
             (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
        (pDVar12->super_VariableWalkerBase).groupType = UIGroupType_Globals;
        (pDVar12->super_VariableWalkerBase).allowLexicalThis = false;
        (pDVar12->super_VariableWalkerBase).allowSuperReference = false;
        (pDVar12->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
        _vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_0137fa50;
        local_40 = pDVar12;
        JsUtil::
        List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(pLVar10,(VariableWalkerBase **)&local_40);
      }
      return;
    }
    scope_00 = FrameDisplay::GetItem(this_01,uVar19);
    if ((scope_00 != (void *)0x0) && (scope_00 != pvVar13)) {
      SVar9 = FrameDisplay::GetScopeType(scope_00);
      if (SVar9 == ScopeType_WithScope) {
        if ((this->frameWalkerFlags & 2) == 0) goto LAB_007e9214;
        this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
        iVar6 = (*this->pFrame->_vptr_DiagStackFrame[10])();
        RecyclableObjectWalker::RecyclableObjectWalker
                  (this_02,(ScriptContext *)CONCAT44(extraout_var_05,iVar6),scope_00);
        pLVar10 = this->pVarWalkers;
        pDVar12 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x35916e);
        uVar20 = local_34;
        DiagScopeVariablesWalker::DiagScopeVariablesWalker
                  (pDVar12,this->pFrame,scope_00,(IDiagObjectModelWalkerBase *)this_02);
        local_40 = pDVar12;
      }
      else {
        if (SVar9 == ScopeType_SlotArray) {
          pLVar10 = this->pVarWalkers;
          local_40 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
          bVar1 = (byte)this->frameWalkerFlags;
          (local_40->super_VariableWalkerBase).pFrame = this->pFrame;
          (local_40->super_VariableWalkerBase).instance = scope_00;
          (local_40->super_VariableWalkerBase).pMembersList =
               (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0;
          (local_40->super_VariableWalkerBase).groupType = UIGroupType_Scope;
          (local_40->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
          (local_40->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
          ppuVar18 = &PTR_Get_0137f9b0;
        }
        else {
          if (SVar9 != ScopeType_ActivationObject) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar14 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x499,"(false)","false");
            if (bVar5) {
              *puVar14 = 0;
              goto LAB_007e9214;
            }
            goto LAB_007e929f;
          }
          pLVar10 = this->pVarWalkers;
          local_40 = (DiagScopeVariablesWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
          bVar1 = (byte)this->frameWalkerFlags;
          (local_40->super_VariableWalkerBase).pFrame = this->pFrame;
          (local_40->super_VariableWalkerBase).instance = scope_00;
          (local_40->super_VariableWalkerBase).pMembersList =
               (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0;
          (local_40->super_VariableWalkerBase).groupType = UIGroupType_Scope;
          (local_40->super_VariableWalkerBase).allowLexicalThis = (bool)(bVar1 >> 2 & 1);
          (local_40->super_VariableWalkerBase).allowSuperReference = (bool)(bVar1 >> 3 & 1);
          ppuVar18 = local_88;
        }
        (local_40->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
        _vptr_IDiagObjectModelWalkerBase = (_func_int **)ppuVar18;
        uVar20 = local_34;
      }
      JsUtil::
      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(pLVar10,(VariableWalkerBase **)&local_40);
    }
LAB_007e9214:
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

LocalsWalker::LocalsWalker(DiagStackFrame* _frame, DWORD _frameWalkerFlags)
        :  pFrame(_frame), frameWalkerFlags(_frameWalkerFlags), pVarWalkers(nullptr), totalLocalsCount(0), hasUserNotDefinedArguments(false)
    {
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        if (pFBody && !pFBody->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // Allocate the container of all walkers.
            ArenaAllocator *arena = pFrame->GetArena();
            pVarWalkers = JsUtil::List<VariableWalkerBase *, ArenaAllocator>::New(arena);

            // Top most function will have one of these regslot, slotarray or activation object.

            FrameDisplay * pDisplay = pFrame->GetFrameDisplay();
            uint scopeCount = (uint)(pDisplay ? pDisplay->GetLength() : 0);

            uint nextStartIndex = 0;

            // Add the catch/with/block expression scope objects.
            if (pFBody->GetScopeObjectChain())
            {
                pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, nullptr, !!(frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso)));
            }

            // In the eval function, we will not show global items directly, instead they should go as a group node.
            bool shouldAddGlobalItemsDirectly = pFBody->GetIsGlobalFunc() && !pFBody->IsEval();
            bool dontAddGlobalsDirectly = (frameWalkerFlags & FrameWalkerFlags::FW_DontAddGlobalsDirectly) == FrameWalkerFlags::FW_DontAddGlobalsDirectly;
            if (shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                // Global properties will be enumerated using RootObjectVariablesWalker
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(), UIGroupType_None));
            }

            DebuggerScope *formalScope = GetScopeWhenHaltAtFormals(pFrame);
            DWORD localsType = GetCurrentFramesLocalsType(pFrame);

            // If we are in the formal scope of a split scoped function then we can skip checking the body scope
            if (!VariableWalkerBase::IsInParamScope(formalScope, pFrame) || pFBody->IsParamAndBodyScopeMerged())
            {
                VariableWalkerBase *pVarWalker = nullptr;

                // More than one localsType can occur in the scope
                if (localsType & FramesLocalType::LocalType_InObject)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (localsType & FramesLocalType::LocalType_InSlot)
                {
                    Assert(scopeCount > 0);
                    pVarWalker = Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference));
                    nextStartIndex++;
                }
                else if (scopeCount > 0 && pFBody->GetFrameDisplayRegister() != 0 && pFBody->IsParamAndBodyScopeMerged())
                {
                    Assert((Var)pDisplay->GetItem(0) == pFrame->GetScriptContext()->GetLibrary()->GetNull());
                    nextStartIndex++;
                }

                if (pVarWalker)
                {
                    pVarWalkers->Add(pVarWalker);
                }
            }

            // If we are halted at formal place, and param and body scopes are splitted we need to make use of formal debugger scope to to determine the locals type.
            if (formalScope != nullptr && !pFBody->IsParamAndBodyScopeMerged())
            {
                if (pFBody->GetPropertyIdOnRegSlotsContainer() && pFBody->GetPropertyIdOnRegSlotsContainer()->formalsUpperBound != Js::Constants::NoRegister)
                {
                    localsType |= FramesLocalType::LocalType_Reg;
                }

                Assert(scopeCount > 0);
                if (formalScope->scopeType == Js::DiagParamScopeInObject)
                {
                    // Need to add the param scope frame display as a separate walker as the ObjectVariablesWalker directly uses the socpe object to retrieve properties
                    pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                else
                {
                    pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, (Js::Var *)pDisplay->GetItem(nextStartIndex), UIGroupType_Param, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                }
                nextStartIndex++;
            }

            if (localsType & FramesLocalType::LocalType_Reg)
            {
                pVarWalkers->Add(Anew(arena, RegSlotVariablesWalker, pFrame, nullptr /*not debugger scope*/, UIGroupType_None, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
            }

            const Js::Var nullVar = pFrame->GetScriptContext()->GetLibrary()->GetNull();
            for (uint i = nextStartIndex; i < (uint)scopeCount; i++)
            {
                Var currentScopeObject = pDisplay->GetItem(i);
                if (currentScopeObject != nullptr && currentScopeObject != nullVar) // Skip nullptr (dummy scope)
                {
                    ScopeType scopeType = FrameDisplay::GetScopeType(currentScopeObject);
                    switch(scopeType)
                    {
                    case ScopeType_ActivationObject:
                        pVarWalkers->Add(Anew(arena, ObjectVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_SlotArray:
                        pVarWalkers->Add(Anew(arena, SlotArrayVariablesWalker, pFrame, currentScopeObject, UIGroupType_Scope, !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowLexicalThis), !!(frameWalkerFlags & FrameWalkerFlags::FW_AllowSuperReference)));
                        break;
                    case ScopeType_WithScope:
                        if( (frameWalkerFlags & FrameWalkerFlags::FW_EnumWithScopeAlso) == FrameWalkerFlags::FW_EnumWithScopeAlso)
                        {
                            RecyclableObjectWalker* withScopeWalker = Anew(arena, RecyclableObjectWalker, pFrame->GetScriptContext(), currentScopeObject);
                            pVarWalkers->Add(Anew(arena, DiagScopeVariablesWalker, pFrame, currentScopeObject, withScopeWalker));
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }

            // No need to add global properties if this is a global function, as it is already done above.
            if (!shouldAddGlobalItemsDirectly && !dontAddGlobalsDirectly)
            {
                pVarWalkers->Add(Anew(arena, RootObjectVariablesWalker, pFrame, pFrame->GetRootObject(),  UIGroupType_Globals));
            }
        }
    }